

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void lambert_lighting(vec3f light_dir,Model *model,TGAImage *image)

{
  vec2i vVar1;
  vec2i vVar2;
  uint8_t R;
  TGAColor color;
  vec<3UL,_double> *local_140;
  vec<2UL,_int> *local_128;
  TGAColor local_105;
  double local_100;
  double intensity;
  vec<3UL,_double> local_e0;
  undefined1 local_c8 [8];
  vec3f n;
  undefined1 local_a8 [8];
  vec3f v;
  size_t j;
  vec3f world_coords [3];
  vec<2UL,_int> local_38;
  vec2i screen_coords [3];
  size_t i;
  TGAImage *image_local;
  Model *model_local;
  
  screen_coords[2].x = 0;
  screen_coords[2].y = 0;
  while( true ) {
    vVar1 = screen_coords[2];
    vVar2 = (vec2i)Model::nfaces(model);
    if ((ulong)vVar2 <= (ulong)vVar1) break;
    local_128 = &local_38;
    do {
      vec<2UL,_int>::vec(local_128);
      local_128 = local_128 + 1;
    } while (local_128 != screen_coords + 2);
    local_140 = (vec<3UL,_double> *)&j;
    do {
      vec<3UL,_double>::vec(local_140);
      local_140 = local_140 + 1;
    } while (local_140 != (vec<3UL,_double> *)&world_coords[2].z);
    for (v.z = 0.0; (ulong)v.z < 3; v.z = (double)((long)v.z + 1)) {
      Model::vert((vec3f *)local_a8,model,(size_t)screen_coords[2],(size_t)v.z);
      vec<2UL,_int>::vec((vec<2UL,_int> *)&n.z,(int)((((double)local_a8 + 1.0) * 1200.0) / 2.0),
                         (int)(((v.x + 1.0) * 1200.0) / 2.0));
      screen_coords[(long)v.z + -1] = (vec2i)n.z;
      world_coords[(long)v.z + -1].z = (double)local_a8;
      world_coords[(long)v.z].x = v.x;
      world_coords[(long)v.z].y = v.y;
    }
    operator-(&local_e0,(vec<3UL,_double> *)&world_coords[1].z,(vec<3UL,_double> *)&j);
    operator-((vec<3UL,_double> *)&intensity,(vec<3UL,_double> *)&world_coords[0].z,
              (vec<3UL,_double> *)&j);
    cross((vec3f *)local_c8,&local_e0,(vec3f *)&intensity);
    vec<3UL,_double>::normalize((vec<3UL,_double> *)local_c8);
    local_100 = dot<3ul,double>((vec<3UL,_double> *)local_c8,&light_dir);
    if (0.0 < local_100) {
      R = (uint8_t)(int)(local_100 * 255.0);
      TGAColor::TGAColor(&local_105,R,R,R,0xff);
      color.bytespp = local_105.bytespp;
      color.bgra[0] = local_105.bgra[0];
      color.bgra[1] = local_105.bgra[1];
      color.bgra[2] = local_105.bgra[2];
      color.bgra[3] = local_105.bgra[3];
      triangle(&local_38,image,color);
    }
    screen_coords[2] = (vec2i)((long)screen_coords[2] + 1);
  }
  return;
}

Assistant:

void lambert_lighting(vec3f light_dir, Model &model, TGAImage &image)
{
    for (size_t i = 0; i < model.nfaces(); i++) {
        vec2i screen_coords[3];
        vec3f world_coords[3];
        for (size_t j = 0; j < 3; j++) {
            vec3f v = model.vert(i, j);
            screen_coords[j] = vec2i(int((v.x + 1.) * width / 2.), int((v.y + 1.) * height / 2.));
            world_coords[j] = v;
        }
        vec3f n = cross(world_coords[2] - world_coords[0], world_coords[1] - world_coords[0]);
        n.normalize();
        double intensity = dot(n, light_dir);
        if (intensity > 0) {
            triangle(screen_coords, image,
                     TGAColor(static_cast<uint8_t>(intensity * 255),
                              static_cast<uint8_t>(intensity * 255),
                              static_cast<uint8_t>(intensity * 255), 255));
        }
    }
}